

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void __thiscall CChat::OnMapLoad(CChat *this)

{
  int iVar1;
  char *format;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  char aBuf [256];
  char acStack_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_CComponent).m_pClient)->m_pClient->m_State == 2) {
    if (this->m_FirstMap == true) {
      this->m_FirstMap = false;
    }
    else {
      format = Localize("Map changed to \'%s\'","");
      iVar1 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface)._vptr_IInterface
                [0x13])();
      str_format(acStack_128,0x100,format,CONCAT44(extraout_var,iVar1));
      AddLine(this,acStack_128,-2,1,-1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChat::OnMapLoad()
{
	if(Client()->State() == IClient::STATE_LOADING)
	{
		if(m_FirstMap)
			m_FirstMap = false;
		else
		{
			// display map rotation marker in chat
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), Localize("Map changed to '%s'"), Client()->GetCurrentMapName());
			AddLine(aBuf, CLIENT_MSG, CHAT_ALL);
		}
	}
}